

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSizePromotion.cpp
# Opt level: O0

bool __thiscall
gl3cts::TextureSizePromotion::FunctionalTest::isChannelTypeNone
          (FunctionalTest *this,TextureInternalFormatDescriptor descriptor,
          ColorChannelSelector channel)

{
  undefined4 *puVar1;
  ColorChannelSelector channel_local;
  FunctionalTest *this_local;
  
  switch(channel) {
  case RED_COMPONENT:
    this_local._7_1_ = descriptor.expected_red_type == 0;
    break;
  case GREEN_COMPONENT:
    this_local._7_1_ = descriptor.expected_green_type == 0;
    break;
  case BLUE_COMPONENT:
    this_local._7_1_ = descriptor.expected_blue_type == 0;
    break;
  case ALPHA_COMPONENT:
    this_local._7_1_ = descriptor.expected_alpha_type == 0;
    break;
  default:
    puVar1 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar1 = 0;
    __cxa_throw(puVar1,&int::typeinfo,0);
  }
  return this_local._7_1_;
}

Assistant:

bool FunctionalTest::isChannelTypeNone(TextureInternalFormatDescriptor descriptor, ColorChannelSelector channel)
{
	switch (channel)
	{
	case RED_COMPONENT:
		return (GL_NONE == descriptor.expected_red_type);
	case GREEN_COMPONENT:
		return (GL_NONE == descriptor.expected_green_type);
	case BLUE_COMPONENT:
		return (GL_NONE == descriptor.expected_blue_type);
	case ALPHA_COMPONENT:
		return (GL_NONE == descriptor.expected_alpha_type);
	default:
		throw 0;
	}

	return false;
}